

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void extend_palette_color_map
               (uint8_t *color_map,int orig_width,int orig_height,int new_width,int new_height)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int j;
  undefined4 local_1c;
  
  if ((in_ECX != in_ESI) || (in_R8D != in_EDX)) {
    for (local_1c = in_EDX + -1; iVar1 = in_EDX, -1 < local_1c; local_1c = local_1c + -1) {
      memmove((void *)(in_RDI + local_1c * in_ECX),(void *)(in_RDI + local_1c * in_ESI),(long)in_ESI
             );
      memset((void *)(in_RDI + local_1c * in_ECX + (long)in_ESI),
             (uint)*(byte *)(in_RDI + (local_1c * in_ECX + in_ESI + -1)),(long)(in_ECX - in_ESI));
    }
    while (local_1c = iVar1, local_1c < in_R8D) {
      memcpy((void *)(in_RDI + local_1c * in_ECX),(void *)(in_RDI + (in_EDX + -1) * in_ECX),
             (long)in_ECX);
      iVar1 = local_1c + 1;
    }
  }
  return;
}

Assistant:

static inline void extend_palette_color_map(uint8_t *const color_map,
                                            int orig_width, int orig_height,
                                            int new_width, int new_height) {
  int j;
  assert(new_width >= orig_width);
  assert(new_height >= orig_height);
  if (new_width == orig_width && new_height == orig_height) return;

  for (j = orig_height - 1; j >= 0; --j) {
    memmove(color_map + j * new_width, color_map + j * orig_width, orig_width);
    // Copy last column to extra columns.
    memset(color_map + j * new_width + orig_width,
           color_map[j * new_width + orig_width - 1], new_width - orig_width);
  }
  // Copy last row to extra rows.
  for (j = orig_height; j < new_height; ++j) {
    memcpy(color_map + j * new_width, color_map + (orig_height - 1) * new_width,
           new_width);
  }
}